

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_sub_16_re_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint res;
  uint dst;
  uint src;
  uint ea;
  
  uVar2 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar1 = m68ki_read_imm_16();
  uVar2 = uVar2 + (int)(short)uVar1;
  uVar3 = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 0xffff;
  uVar1 = m68ki_read_16_fc(uVar2,m68ki_cpu.s_flag | m68ki_address_space);
  uVar4 = uVar1 - uVar3;
  m68ki_cpu.n_flag = uVar4 >> 8;
  m68ki_cpu.not_z_flag = uVar4 & 0xffff;
  m68ki_cpu.x_flag = uVar4 >> 8;
  m68ki_cpu.v_flag = ((uVar3 ^ uVar1) & (uVar4 ^ uVar1)) >> 8;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc(uVar2,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_sub_16_re_di(void)
{
	uint ea = EA_AY_DI_16();
	uint src = MASK_OUT_ABOVE_16(DX);
	uint dst = m68ki_read_16(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);

	m68ki_write_16(ea, FLAG_Z);
}